

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall randomx::Instruction::h_FADD_R(Instruction *this,ostream *os)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  
  bVar1 = this->dst;
  bVar2 = this->src;
  poVar3 = std::operator<<(os,"f");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1 & 3);
  poVar3 = std::operator<<(poVar3,", a");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar2 & 3);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void Instruction::h_FADD_R(std::ostream& os) const {
		auto dstIndex = dst % RegisterCountFlt;
		auto srcIndex = src % RegisterCountFlt;
		os << "f" << dstIndex << ", a" << srcIndex << std::endl;
	}